

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  TrackerBase *pTVar2;
  ITracker *pIVar3;
  ReusableStringStream *pRVar4;
  SourceLineInfo local_c8;
  ReusableStringStream local_b8;
  string local_a0;
  SourceLineInfo local_70;
  ReusableStringStream local_60;
  string local_48;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_20;
  shared_ptr<Catch::TestCaseTracking::ITracker> *local_18;
  TrackerBase *local_10;
  TrackerBase *this_local;
  
  local_10 = this;
  while (pTVar2 = (TrackerBase *)TrackerContext::currentTracker(this->m_ctx), pTVar2 != this) {
    pIVar3 = TrackerContext::currentTracker(this->m_ctx);
    (*pIVar3->_vptr_ITracker[8])();
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_60);
    SourceLineInfo::SourceLineInfo
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/MisterTea[P]UniversalStacktrace/external/Catch2/single_include/catch2/catch.hpp"
               ,0x3890);
    pRVar4 = ReusableStringStream::operator<<(&local_60,&local_70);
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [26])": Internal Catch2 error: ");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [18])"Illogical state: ");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,&this->m_runState);
    ReusableStringStream::str_abi_cxx11_(&local_48,pRVar4);
    throw_logic_error(&local_48);
  case Executing:
    this->m_runState = CompletedSuccessfully;
    break;
  case ExecutingChildren:
    local_18 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               clara::std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::begin(&this->m_children);
    local_20 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
               clara::std::
               vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
               ::end(&this->m_children);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::TrackerBase::close()::__0>
                      (local_18,local_20);
    if (bVar1) {
      this->m_runState = CompletedSuccessfully;
    }
    break;
  case NeedsAnotherRun:
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_b8);
    SourceLineInfo::SourceLineInfo
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/MisterTea[P]UniversalStacktrace/external/Catch2/single_include/catch2/catch.hpp"
               ,0x3893);
    pRVar4 = ReusableStringStream::operator<<(&local_b8,&local_c8);
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [26])": Internal Catch2 error: ");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [16])"Unknown state: ");
    pRVar4 = ReusableStringStream::operator<<(pRVar4,&this->m_runState);
    ReusableStringStream::str_abi_cxx11_(&local_a0,pRVar4);
    throw_logic_error(&local_a0);
  }
  moveToParent(this);
  TrackerContext::completeCycle(this->m_ctx);
  return extraout_EAX;
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }